

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_data.hpp
# Opt level: O2

void duckdb::ArrowListData<int>::AppendOffsets
               (ArrowAppendData *append_data,UnifiedVectorFormat *format,idx_t from,idx_t to,
               vector<unsigned_int,_true> *child_sel)

{
  sel_t *psVar1;
  long lVar2;
  bool bVar3;
  ArrowBuffer *this;
  InvalidInputException *this_00;
  long lVar4;
  idx_t iVar5;
  ulong row_idx;
  int *piVar6;
  idx_t k;
  int params_1;
  ulong uVar7;
  allocator local_91;
  data_ptr_t local_90;
  UnifiedVectorFormat *local_88;
  idx_t local_80;
  data_ptr_t local_78;
  TemplatedValidityMask<unsigned_long> *local_70;
  ArrowAppendData *local_68;
  idx_t local_60;
  ulong local_58;
  string local_50;
  
  local_60 = to;
  this = ArrowAppendData::GetMainBuffer(append_data);
  ArrowBuffer::resize(this,this->count + (to - from) * 4 + 4);
  local_78 = format->data;
  local_90 = this->dataptr;
  iVar5 = append_data->row_count;
  if (iVar5 == 0) {
    local_90[0] = '\0';
    local_90[1] = '\0';
    local_90[2] = '\0';
    local_90[3] = '\0';
  }
  params_1 = *(int *)(local_90 + iVar5 * 4);
  local_70 = &(format->validity).super_TemplatedValidityMask<unsigned_long>;
  iVar5 = from;
  local_88 = format;
  local_80 = from;
  local_68 = append_data;
  do {
    if (local_60 <= from) {
      return;
    }
    psVar1 = local_88->sel->sel_vector;
    row_idx = from;
    if (psVar1 != (sel_t *)0x0) {
      row_idx = (ulong)psVar1[from];
    }
    lVar4 = (from - iVar5) + local_68->row_count + 1;
    local_58 = from;
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_70,row_idx);
    if (bVar3) {
      lVar2 = *(long *)(local_78 + row_idx * 0x10 + 8);
      uVar7 = params_1 + lVar2;
      if ((uVar7 & 0xffffffff80000000) != 0) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   "Arrow Appender: The maximum combined list offset for regular list buffers is %u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list buffers"
                   ,&local_91);
        InvalidInputException::InvalidInputException<int,int>(this_00,&local_50,0x7fffffff,params_1)
        ;
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      piVar6 = (int *)(local_78 + row_idx * 0x10);
      params_1 = (int)uVar7;
      *(int *)(local_90 + lVar4 * 4) = params_1;
      for (lVar4 = 0; iVar5 = local_80, lVar2 != lVar4; lVar4 = lVar4 + 1) {
        local_50._M_dataplus._M_p._0_4_ = *piVar6 + (int)lVar4;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                   (uint *)&local_50);
      }
    }
    else {
      *(int *)(local_90 + lVar4 * 4) = params_1;
    }
    from = local_58 + 1;
  } while( true );
}

Assistant:

static void AppendOffsets(ArrowAppendData &append_data, UnifiedVectorFormat &format, idx_t from, idx_t to,
	                          vector<sel_t> &child_sel) {
		// resize the offset buffer - the offset buffer holds the offsets into the child array
		idx_t size = to - from;
		auto &main_buffer = append_data.GetMainBuffer();

		main_buffer.resize(main_buffer.size() + sizeof(BUFTYPE) * (size + 1));
		auto data = UnifiedVectorFormat::GetData<list_entry_t>(format);
		auto offset_data = main_buffer.GetData<BUFTYPE>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// set up the offsets using the list entries
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto offset_idx = append_data.row_count + i + 1 - from;

			if (!format.validity.RowIsValid(source_idx)) {
				offset_data[offset_idx] = last_offset;
				continue;
			}

			// append the offset data
			auto list_length = data[source_idx].length;
			if (std::is_same<BUFTYPE, int32_t>::value == true &&
			    (uint64_t)last_offset + list_length > NumericLimits<int32_t>::Maximum()) {
				throw InvalidInputException(
				    "Arrow Appender: The maximum combined list offset for regular list buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), last_offset);
			}
			last_offset += list_length;
			offset_data[offset_idx] = last_offset;

			for (idx_t k = 0; k < list_length; k++) {
				child_sel.push_back(UnsafeNumericCast<sel_t>(data[source_idx].offset + k));
			}
		}
	}